

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagnosticEngine.cpp
# Opt level: O3

void __thiscall
slang::DiagnosticEngine::setMappingsFromPragmasImpl<slang::SourceManager::DiagnosticDirectiveInfo>
          (DiagnosticEngine *this,BufferID buffer,
          span<const_slang::SourceManager::DiagnosticDirectiveInfo,_18446744073709551615UL>
          directives,Diagnostics *diags)

{
  size_t *psVar1;
  group_type_pointer pgVar2;
  group_type_pointer pgVar3;
  char *pcVar4;
  undefined4 uVar5;
  DiagCode *pDVar6;
  value_type_pointer ppVar7;
  uint uVar8;
  int iVar9;
  undefined1 auVar10 [16];
  ushort uVar11;
  DiagnosticEngine *pDVar12;
  DiagGroup *pDVar13;
  Diagnostic *this_00;
  ulong uVar14;
  char_pointer puVar15;
  char_pointer puVar16;
  DiagnosticDirectiveInfo *directive;
  DiagCode *pDVar17;
  char_pointer puVar18;
  DiagCode DVar19;
  value_type_pointer ppVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  uint uVar24;
  size_type __rlen;
  ulong uVar25;
  long *plVar26;
  long lVar27;
  table_element_pointer ppVar28;
  uchar uVar29;
  char cVar30;
  uchar uVar33;
  char cVar34;
  uchar uVar35;
  char cVar36;
  byte bVar37;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  iterator iVar41;
  span<const_slang::DiagCode,_18446744073709551615UL> sVar42;
  string_view arg;
  vector<boost::unordered::unordered_flat_map<slang::DiagCode,_slang::DiagnosticSeverity,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>,_std::allocator<boost::unordered::unordered_flat_map<slang::DiagCode,_slang::DiagnosticSeverity,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>_>_>
  mappingStack;
  locator res;
  anon_class_24_3_94aef59f noteDiag;
  try_emplace_args_t local_10d;
  BufferID local_10c;
  pair<const_slang::DiagCode,_slang::DiagnosticSeverity> local_108;
  DiagnosticDirectiveInfo *local_100;
  pointer local_f8;
  DiagnosticEngine *local_f0;
  long local_e8;
  table_core<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,boost::unordered::unordered_flat_map<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>,slang::hash<slang::BufferID,void>,std::equal_to<slang::BufferID>,std::allocator<std::pair<slang::BufferID_const,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::DiagCode,void>,std::equal_to<slang::DiagCode>,std::allocator<std::pair<slang::DiagCode_const,boost::unordered::unordered_flat_map<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>,slang::hash<slang::BufferID,void>,std::equal_to<slang::BufferID>,std::allocator<std::pair<slang::BufferID_const,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>>>>>>
  *local_e0;
  size_t *local_d8;
  unordered_flat_map<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>,_slang::hash<slang::BufferID,_void>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<const_slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>_>_>
  *local_d0;
  pointer puVar43;
  string_view name;
  SourceManager *pSVar44;
  value_type_pointer local_98;
  Diagnostics *local_90;
  DiagnosticDirectiveInfo *local_88;
  DiagnosticEngine *local_80;
  BufferID *local_78;
  vector<boost::unordered::unordered_flat_map<slang::DiagCode,_slang::DiagnosticSeverity,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>,_std::allocator<boost::unordered::unordered_flat_map<slang::DiagCode,_slang::DiagnosticSeverity,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>_>_>
  *local_70;
  char local_68;
  char cStack_67;
  char cStack_66;
  byte bStack_65;
  char cStack_64;
  char cStack_63;
  char cStack_62;
  byte bStack_61;
  char cStack_60;
  char cStack_5f;
  char cStack_5e;
  byte bStack_5d;
  char cStack_5c;
  char cStack_5b;
  char cStack_5a;
  byte bStack_59;
  uchar local_58;
  uchar uStack_57;
  uchar uStack_56;
  byte bStack_55;
  uchar uStack_54;
  uchar uStack_53;
  uchar uStack_52;
  byte bStack_51;
  uchar uStack_50;
  uchar uStack_4f;
  uchar uStack_4e;
  byte bStack_4d;
  uchar uStack_4c;
  uchar uStack_4b;
  uchar uStack_4a;
  byte bStack_49;
  uchar local_48;
  uchar uStack_47;
  uchar uStack_46;
  byte bStack_45;
  uchar uStack_44;
  uchar uStack_43;
  uchar uStack_42;
  byte bStack_41;
  uchar uStack_40;
  uchar uStack_3f;
  uchar uStack_3e;
  byte bStack_3d;
  uchar uStack_3c;
  uchar uStack_3b;
  uchar uStack_3a;
  byte bStack_39;
  
  directive = directives._M_ptr;
  name._M_len = 0;
  name._M_str = (char *)0x0;
  local_10c.id = buffer.id;
  local_90 = diags;
  std::
  vector<boost::unordered::unordered_flat_map<slang::DiagCode,_slang::DiagnosticSeverity,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>,_std::allocator<boost::unordered::unordered_flat_map<slang::DiagCode,_slang::DiagnosticSeverity,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>_>_>
  ::emplace_back<>((vector<boost::unordered::unordered_flat_map<slang::DiagCode,_slang::DiagnosticSeverity,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>,_std::allocator<boost::unordered::unordered_flat_map<slang::DiagCode,_slang::DiagnosticSeverity,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>_>_>
                    *)&stack0xffffffffffffff38);
  local_78 = &local_10c;
  local_f0 = this;
  local_80 = this;
  local_70 = (vector<boost::unordered::unordered_flat_map<slang::DiagCode,_slang::DiagnosticSeverity,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>,_std::allocator<boost::unordered::unordered_flat_map<slang::DiagCode,_slang::DiagnosticSeverity,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>_>_>
              *)&stack0xffffffffffffff38;
  if (directives._M_extent._M_extent_value._M_extent_value != 0) {
    local_88 = directive + directives._M_extent._M_extent_value._M_extent_value;
    local_e0 = (table_core<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,boost::unordered::unordered_flat_map<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>,slang::hash<slang::BufferID,void>,std::equal_to<slang::BufferID>,std::allocator<std::pair<slang::BufferID_const,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::DiagCode,void>,std::equal_to<slang::DiagCode>,std::allocator<std::pair<slang::DiagCode_const,boost::unordered::unordered_flat_map<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>,slang::hash<slang::BufferID,void>,std::equal_to<slang::BufferID>,std::allocator<std::pair<slang::BufferID_const,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>>>>>>
                *)&this->diagMappings;
    do {
      uVar25 = (directive->name)._M_len;
      plVar26 = (long *)(directive->name)._M_str;
      pSVar44 = (SourceManager *)name._M_str;
      if (uVar25 == 7) {
        if (*(int *)((long)plVar26 + 3) != 0x5f5f706f || (int)*plVar26 != 0x6f705f5f)
        goto LAB_0038f96b;
        puVar43 = (pointer)name._M_len;
        lVar27 = (long)pSVar44 - (long)puVar43;
        if (1 < (ulong)((lVar27 >> 4) * -0x5555555555555555)) {
          local_e8 = lVar27;
          iVar41 = boost::unordered::detail::foa::
                   table<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_slang::DiagnosticSeverity>,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>
                   ::begin((table<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_slang::DiagnosticSeverity>,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>
                            *)&pSVar44[-1].diagDirectives.table_.
                               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo>_>,_slang::hash<slang::BufferID>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<const_slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo>_>_>_>
                               .arrays.groups_size_mask);
          if (iVar41.p_ != (table_element_pointer)0x0) {
            local_d8 = &directive->offset;
            local_100 = directive;
            local_f8 = puVar43;
LAB_0038fa4d:
            do {
              pDVar12 = local_f0;
              local_108 = *iVar41.p_;
              DVar19 = local_108.first;
              auVar38 = ZEXT416((int)DVar19 << 0x10 | (uint)DVar19 >> 0x10) *
                        ZEXT816(0x9e3779b97f4a7c15);
              uVar21 = auVar38._8_8_ ^ auVar38._0_8_;
              uVar14 = uVar21 >> ((byte)(local_f0->diagMappings).table_.
                                        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_boost::unordered::unordered_flat_map<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping>,_slang::hash<slang::BufferID>_>_>,_slang::hash<slang::DiagCode>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_boost::unordered::unordered_flat_map<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping>,_slang::hash<slang::BufferID>_>_>_>_>
                                        .arrays.groups_size_index & 0x3f);
              uVar5 = (&boost::unordered::detail::foa::
                        group15<boost::unordered::detail::foa::plain_integral>::
                        match_word(unsigned_long)::word)[uVar21 & 0xff];
              ppVar20 = (local_f0->diagMappings).table_.
                        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_boost::unordered::unordered_flat_map<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping>,_slang::hash<slang::BufferID>_>_>,_slang::hash<slang::DiagCode>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_boost::unordered::unordered_flat_map<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping>,_slang::hash<slang::BufferID>_>_>_>_>
                        .arrays.elements_;
              uVar25 = (local_f0->diagMappings).table_.
                       super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_boost::unordered::unordered_flat_map<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping>,_slang::hash<slang::BufferID>_>_>,_slang::hash<slang::DiagCode>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_boost::unordered::unordered_flat_map<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping>,_slang::hash<slang::BufferID>_>_>_>_>
                       .arrays.groups_size_mask;
              uVar23 = 0;
              uVar22 = uVar14;
              do {
                pgVar2 = (local_f0->diagMappings).table_.
                         super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_boost::unordered::unordered_flat_map<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping>,_slang::hash<slang::BufferID>_>_>,_slang::hash<slang::DiagCode>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_boost::unordered::unordered_flat_map<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping>,_slang::hash<slang::BufferID>_>_>_>_>
                         .arrays.groups_ + uVar22;
                local_48 = pgVar2->m[0].n;
                uStack_47 = pgVar2->m[1].n;
                uStack_46 = pgVar2->m[2].n;
                bStack_45 = pgVar2->m[3].n;
                uStack_44 = pgVar2->m[4].n;
                uStack_43 = pgVar2->m[5].n;
                uStack_42 = pgVar2->m[6].n;
                bStack_41 = pgVar2->m[7].n;
                uStack_40 = pgVar2->m[8].n;
                uStack_3f = pgVar2->m[9].n;
                uStack_3e = pgVar2->m[10].n;
                bStack_3d = pgVar2->m[0xb].n;
                uStack_3c = pgVar2->m[0xc].n;
                uStack_3b = pgVar2->m[0xd].n;
                uStack_3a = pgVar2->m[0xe].n;
                bStack_39 = pgVar2->m[0xf].n;
                uVar29 = (uchar)uVar5;
                auVar38[0] = -(local_48 == uVar29);
                uVar33 = (uchar)((uint)uVar5 >> 8);
                auVar38[1] = -(uStack_47 == uVar33);
                uVar35 = (uchar)((uint)uVar5 >> 0x10);
                auVar38[2] = -(uStack_46 == uVar35);
                bVar37 = (byte)((uint)uVar5 >> 0x18);
                auVar38[3] = -(bStack_45 == bVar37);
                auVar38[4] = -(uStack_44 == uVar29);
                auVar38[5] = -(uStack_43 == uVar33);
                auVar38[6] = -(uStack_42 == uVar35);
                auVar38[7] = -(bStack_41 == bVar37);
                auVar38[8] = -(uStack_40 == uVar29);
                auVar38[9] = -(uStack_3f == uVar33);
                auVar38[10] = -(uStack_3e == uVar35);
                auVar38[0xb] = -(bStack_3d == bVar37);
                auVar38[0xc] = -(uStack_3c == uVar29);
                auVar38[0xd] = -(uStack_3b == uVar33);
                auVar38[0xe] = -(uStack_3a == uVar35);
                auVar38[0xf] = -(bStack_39 == bVar37);
                for (uVar24 = (uint)(ushort)((ushort)(SUB161(auVar38 >> 7,0) & 1) |
                                             (ushort)(SUB161(auVar38 >> 0xf,0) & 1) << 1 |
                                             (ushort)(SUB161(auVar38 >> 0x17,0) & 1) << 2 |
                                             (ushort)(SUB161(auVar38 >> 0x1f,0) & 1) << 3 |
                                             (ushort)(SUB161(auVar38 >> 0x27,0) & 1) << 4 |
                                             (ushort)(SUB161(auVar38 >> 0x2f,0) & 1) << 5 |
                                             (ushort)(SUB161(auVar38 >> 0x37,0) & 1) << 6 |
                                             (ushort)(SUB161(auVar38 >> 0x3f,0) & 1) << 7 |
                                             (ushort)(SUB161(auVar38 >> 0x47,0) & 1) << 8 |
                                             (ushort)(SUB161(auVar38 >> 0x4f,0) & 1) << 9 |
                                             (ushort)(SUB161(auVar38 >> 0x57,0) & 1) << 10 |
                                             (ushort)(SUB161(auVar38 >> 0x5f,0) & 1) << 0xb |
                                             (ushort)(SUB161(auVar38 >> 0x67,0) & 1) << 0xc |
                                             (ushort)(SUB161(auVar38 >> 0x6f,0) & 1) << 0xd |
                                            (ushort)(SUB161(auVar38 >> 0x77,0) & 1) << 0xe);
                    uVar24 != 0; uVar24 = uVar24 - 1 & uVar24) {
                  uVar8 = 0;
                  if (uVar24 != 0) {
                    for (; (uVar24 >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
                    }
                  }
                  if (ppVar20[uVar22 * 0xf + (ulong)uVar8].first == DVar19) {
                    ppVar20 = ppVar20 + uVar22 * 0xf + (ulong)uVar8;
                    goto LAB_0038fb7f;
                  }
                }
                if (((&boost::unordered::detail::foa::
                       group15<boost::unordered::detail::foa::plain_integral>::
                       is_not_overflowed(unsigned_long)::shift)[(uint)uVar21 & 7] & bStack_39) == 0)
                break;
                lVar27 = uVar22 + uVar23;
                uVar23 = uVar23 + 1;
                uVar22 = lVar27 + 1U & uVar25;
              } while (uVar23 <= uVar25);
              if ((local_f0->diagMappings).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_boost::unordered::unordered_flat_map<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping>,_slang::hash<slang::BufferID>_>_>,_slang::hash<slang::DiagCode>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_boost::unordered::unordered_flat_map<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping>,_slang::hash<slang::BufferID>_>_>_>_>
                  .size_ctrl.size <
                  (local_f0->diagMappings).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_boost::unordered::unordered_flat_map<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping>,_slang::hash<slang::BufferID>_>_>,_slang::hash<slang::DiagCode>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_boost::unordered::unordered_flat_map<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping>,_slang::hash<slang::BufferID>_>_>_>_>
                  .size_ctrl.ml) {
                boost::unordered::detail::foa::
                table_core<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,boost::unordered::unordered_flat_map<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>,slang::hash<slang::BufferID,void>,std::equal_to<slang::BufferID>,std::allocator<std::pair<slang::BufferID_const,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::DiagCode,void>,std::equal_to<slang::DiagCode>,std::allocator<std::pair<slang::DiagCode_const,boost::unordered::unordered_flat_map<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>,slang::hash<slang::BufferID,void>,std::equal_to<slang::BufferID>,std::allocator<std::pair<slang::BufferID_const,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>>>>>>
                ::
                nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::DiagCode_const&>
                          ((locator *)&stack0xffffffffffffff58,local_e0,(arrays_type *)local_e0,
                           uVar14,uVar21,&local_10d,&local_108.first);
                psVar1 = &(pDVar12->diagMappings).table_.
                          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_boost::unordered::unordered_flat_map<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping>,_slang::hash<slang::BufferID>_>_>,_slang::hash<slang::DiagCode>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_boost::unordered::unordered_flat_map<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping>,_slang::hash<slang::BufferID>_>_>_>_>
                          .size_ctrl.size;
                *psVar1 = *psVar1 + 1;
                ppVar20 = local_98;
              }
              else {
                boost::unordered::detail::foa::
                table_core<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,boost::unordered::unordered_flat_map<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>,slang::hash<slang::BufferID,void>,std::equal_to<slang::BufferID>,std::allocator<std::pair<slang::BufferID_const,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::DiagCode,void>,std::equal_to<slang::DiagCode>,std::allocator<std::pair<slang::DiagCode_const,boost::unordered::unordered_flat_map<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>,slang::hash<slang::BufferID,void>,std::equal_to<slang::BufferID>,std::allocator<std::pair<slang::BufferID_const,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>>>>>>
                ::
                unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::DiagCode_const&>
                          ((locator *)&stack0xffffffffffffff58,local_e0,uVar21,&local_10d,
                           &local_108.first);
                ppVar20 = local_98;
              }
LAB_0038fb7f:
              local_d0 = &ppVar20->second;
              uVar14 = SUB168(ZEXT416(local_10c.id) * ZEXT816(0x9e3779b97f4a7c15),8) ^
                       SUB168(ZEXT416(local_10c.id) * ZEXT816(0x9e3779b97f4a7c15),0);
              uVar22 = uVar14 >> ((byte)(ppVar20->second).table_.
                                        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping>_>,_slang::hash<slang::BufferID>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<const_slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping>_>_>_>
                                        .arrays.groups_size_index & 0x3f);
              uVar5 = (&boost::unordered::detail::foa::
                        group15<boost::unordered::detail::foa::plain_integral>::
                        match_word(unsigned_long)::word)[uVar14 & 0xff];
              uVar21 = 0;
              uVar25 = uVar22;
              do {
                pgVar3 = (ppVar20->second).table_.
                         super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping>_>,_slang::hash<slang::BufferID>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<const_slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping>_>_>_>
                         .arrays.groups_ + uVar25;
                local_58 = pgVar3->m[0].n;
                uStack_57 = pgVar3->m[1].n;
                uStack_56 = pgVar3->m[2].n;
                bStack_55 = pgVar3->m[3].n;
                uStack_54 = pgVar3->m[4].n;
                uStack_53 = pgVar3->m[5].n;
                uStack_52 = pgVar3->m[6].n;
                bStack_51 = pgVar3->m[7].n;
                uStack_50 = pgVar3->m[8].n;
                uStack_4f = pgVar3->m[9].n;
                uStack_4e = pgVar3->m[10].n;
                bStack_4d = pgVar3->m[0xb].n;
                uStack_4c = pgVar3->m[0xc].n;
                uStack_4b = pgVar3->m[0xd].n;
                uStack_4a = pgVar3->m[0xe].n;
                bStack_49 = pgVar3->m[0xf].n;
                uVar29 = (uchar)uVar5;
                auVar39[0] = -(local_58 == uVar29);
                uVar33 = (uchar)((uint)uVar5 >> 8);
                auVar39[1] = -(uStack_57 == uVar33);
                uVar35 = (uchar)((uint)uVar5 >> 0x10);
                auVar39[2] = -(uStack_56 == uVar35);
                bVar37 = (byte)((uint)uVar5 >> 0x18);
                auVar39[3] = -(bStack_55 == bVar37);
                auVar39[4] = -(uStack_54 == uVar29);
                auVar39[5] = -(uStack_53 == uVar33);
                auVar39[6] = -(uStack_52 == uVar35);
                auVar39[7] = -(bStack_51 == bVar37);
                auVar39[8] = -(uStack_50 == uVar29);
                auVar39[9] = -(uStack_4f == uVar33);
                auVar39[10] = -(uStack_4e == uVar35);
                auVar39[0xb] = -(bStack_4d == bVar37);
                auVar39[0xc] = -(uStack_4c == uVar29);
                auVar39[0xd] = -(uStack_4b == uVar33);
                auVar39[0xe] = -(uStack_4a == uVar35);
                auVar39[0xf] = -(bStack_49 == bVar37);
                uVar24 = (uint)(ushort)((ushort)(SUB161(auVar39 >> 7,0) & 1) |
                                        (ushort)(SUB161(auVar39 >> 0xf,0) & 1) << 1 |
                                        (ushort)(SUB161(auVar39 >> 0x17,0) & 1) << 2 |
                                        (ushort)(SUB161(auVar39 >> 0x1f,0) & 1) << 3 |
                                        (ushort)(SUB161(auVar39 >> 0x27,0) & 1) << 4 |
                                        (ushort)(SUB161(auVar39 >> 0x2f,0) & 1) << 5 |
                                        (ushort)(SUB161(auVar39 >> 0x37,0) & 1) << 6 |
                                        (ushort)(SUB161(auVar39 >> 0x3f,0) & 1) << 7 |
                                        (ushort)(SUB161(auVar39 >> 0x47,0) & 1) << 8 |
                                        (ushort)(SUB161(auVar39 >> 0x4f,0) & 1) << 9 |
                                        (ushort)(SUB161(auVar39 >> 0x57,0) & 1) << 10 |
                                        (ushort)(SUB161(auVar39 >> 0x5f,0) & 1) << 0xb |
                                        (ushort)(SUB161(auVar39 >> 0x67,0) & 1) << 0xc |
                                        (ushort)(SUB161(auVar39 >> 0x6f,0) & 1) << 0xd |
                                       (ushort)(SUB161(auVar39 >> 0x77,0) & 1) << 0xe);
                if (uVar24 != 0) {
                  ppVar7 = (ppVar20->second).table_.
                           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping>_>,_slang::hash<slang::BufferID>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<const_slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping>_>_>_>
                           .arrays.elements_;
                  do {
                    iVar9 = 0;
                    if (uVar24 != 0) {
                      for (; (uVar24 >> iVar9 & 1) == 0; iVar9 = iVar9 + 1) {
                      }
                    }
                    if (local_10c.id ==
                        *(uint *)((long)&ppVar7[uVar25 * 0xf].first.id + (ulong)(uint)(iVar9 << 5)))
                    {
                      ppVar20 = (value_type_pointer)
                                ((long)&ppVar7[uVar25 * 0xf].first.id + (ulong)(uint)(iVar9 << 5));
                      goto LAB_0038fcb1;
                    }
                    uVar24 = uVar24 - 1 & uVar24;
                  } while (uVar24 != 0);
                }
                if (((&boost::unordered::detail::foa::
                       group15<boost::unordered::detail::foa::plain_integral>::
                       is_not_overflowed(unsigned_long)::shift)[(uint)uVar14 & 7] & bStack_49) == 0)
                break;
                uVar23 = (ppVar20->second).table_.
                         super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping>_>,_slang::hash<slang::BufferID>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<const_slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping>_>_>_>
                         .arrays.groups_size_mask;
                lVar27 = uVar25 + uVar21;
                uVar21 = uVar21 + 1;
                uVar25 = lVar27 + 1U & uVar23;
              } while (uVar21 <= uVar23);
              if ((ppVar20->second).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping>_>,_slang::hash<slang::BufferID>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<const_slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping>_>_>_>
                  .size_ctrl.size <
                  (ppVar20->second).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping>_>,_slang::hash<slang::BufferID>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<const_slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping>_>_>_>
                  .size_ctrl.ml) {
                boost::unordered::detail::foa::
                table_core<boost::unordered::detail::foa::flat_map_types<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::BufferID,void>,std::equal_to<slang::BufferID>,std::allocator<std::pair<slang::BufferID_const,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>>>
                ::
                nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::BufferID_const&>
                          ((locator *)&stack0xffffffffffffff58,
                           (table_core<boost::unordered::detail::foa::flat_map_types<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::BufferID,void>,std::equal_to<slang::BufferID>,std::allocator<std::pair<slang::BufferID_const,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>>>
                            *)local_d0,(arrays_type *)local_d0,uVar22,uVar14,&local_10d,&local_10c);
                psVar1 = &(ppVar20->second).table_.
                          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping>_>,_slang::hash<slang::BufferID>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<const_slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping>_>_>_>
                          .size_ctrl.size;
                *psVar1 = *psVar1 + 1;
                ppVar20 = local_98;
              }
              else {
                boost::unordered::detail::foa::
                table_core<boost::unordered::detail::foa::flat_map_types<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::BufferID,void>,std::equal_to<slang::BufferID>,std::allocator<std::pair<slang::BufferID_const,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>>>
                ::
                unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::BufferID_const&>
                          ((locator *)&stack0xffffffffffffff58,
                           (table_core<boost::unordered::detail::foa::flat_map_types<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::BufferID,void>,std::equal_to<slang::BufferID>,std::allocator<std::pair<slang::BufferID_const,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>>>
                            *)local_d0,uVar14,&local_10d,&local_10c);
                ppVar20 = local_98;
              }
LAB_0038fcb1:
              directive = local_100;
              auVar10._8_8_ = 0;
              auVar10._0_8_ =
                   (ulong)local_108 >> 0x10 & 0xffff | (ulong)(uint)((int)local_108.first << 0x10);
              uVar22 = SUB168(auVar10 * ZEXT816(0x9e3779b97f4a7c15),8) ^
                       SUB168(auVar10 * ZEXT816(0x9e3779b97f4a7c15),0);
              uVar25 = uVar22 >> (*(byte *)((long)&local_f8[-2].table_.
                                                                                                      
                                                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_slang::DiagnosticSeverity>,_slang::hash<slang::DiagCode>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>
                                                  .arrays.groups_size_index + local_e8) & 0x3f);
              uVar5 = (&boost::unordered::detail::foa::
                        group15<boost::unordered::detail::foa::plain_integral>::
                        match_word(unsigned_long)::word)[uVar22 & 0xff];
              uVar14 = 0;
              do {
                pcVar4 = (char *)(*(long *)((long)local_f8 + local_e8 + -0x50) + uVar25 * 0x10);
                local_68 = *pcVar4;
                cStack_67 = pcVar4[1];
                cStack_66 = pcVar4[2];
                bStack_65 = pcVar4[3];
                cStack_64 = pcVar4[4];
                cStack_63 = pcVar4[5];
                cStack_62 = pcVar4[6];
                bStack_61 = pcVar4[7];
                cStack_60 = pcVar4[8];
                cStack_5f = pcVar4[9];
                cStack_5e = pcVar4[10];
                bStack_5d = pcVar4[0xb];
                cStack_5c = pcVar4[0xc];
                cStack_5b = pcVar4[0xd];
                cStack_5a = pcVar4[0xe];
                bStack_59 = pcVar4[0xf];
                cVar30 = (char)uVar5;
                auVar40[0] = -(local_68 == cVar30);
                cVar34 = (char)((uint)uVar5 >> 8);
                auVar40[1] = -(cStack_67 == cVar34);
                cVar36 = (char)((uint)uVar5 >> 0x10);
                auVar40[2] = -(cStack_66 == cVar36);
                bVar37 = (byte)((uint)uVar5 >> 0x18);
                auVar40[3] = -(bStack_65 == bVar37);
                auVar40[4] = -(cStack_64 == cVar30);
                auVar40[5] = -(cStack_63 == cVar34);
                auVar40[6] = -(cStack_62 == cVar36);
                auVar40[7] = -(bStack_61 == bVar37);
                auVar40[8] = -(cStack_60 == cVar30);
                auVar40[9] = -(cStack_5f == cVar34);
                auVar40[10] = -(cStack_5e == cVar36);
                auVar40[0xb] = -(bStack_5d == bVar37);
                auVar40[0xc] = -(cStack_5c == cVar30);
                auVar40[0xd] = -(cStack_5b == cVar34);
                auVar40[0xe] = -(cStack_5a == cVar36);
                auVar40[0xf] = -(bStack_59 == bVar37);
                uVar24 = (uint)(ushort)((ushort)(SUB161(auVar40 >> 7,0) & 1) |
                                        (ushort)(SUB161(auVar40 >> 0xf,0) & 1) << 1 |
                                        (ushort)(SUB161(auVar40 >> 0x17,0) & 1) << 2 |
                                        (ushort)(SUB161(auVar40 >> 0x1f,0) & 1) << 3 |
                                        (ushort)(SUB161(auVar40 >> 0x27,0) & 1) << 4 |
                                        (ushort)(SUB161(auVar40 >> 0x2f,0) & 1) << 5 |
                                        (ushort)(SUB161(auVar40 >> 0x37,0) & 1) << 6 |
                                        (ushort)(SUB161(auVar40 >> 0x3f,0) & 1) << 7 |
                                        (ushort)(SUB161(auVar40 >> 0x47,0) & 1) << 8 |
                                        (ushort)(SUB161(auVar40 >> 0x4f,0) & 1) << 9 |
                                        (ushort)(SUB161(auVar40 >> 0x57,0) & 1) << 10 |
                                        (ushort)(SUB161(auVar40 >> 0x5f,0) & 1) << 0xb |
                                        (ushort)(SUB161(auVar40 >> 0x67,0) & 1) << 0xc |
                                        (ushort)(SUB161(auVar40 >> 0x6f,0) & 1) << 0xd |
                                       (ushort)(SUB161(auVar40 >> 0x77,0) & 1) << 0xe);
                if (uVar24 != 0) {
                  lVar27 = *(long *)((long)local_f8 + local_e8 + -0x48) + uVar25 * 0x78;
                  do {
                    uVar8 = 0;
                    if (uVar24 != 0) {
                      for (; (uVar24 >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
                      }
                    }
                    if (local_108.first == *(DiagCode *)(lVar27 + (ulong)uVar8 * 8)) {
                      std::
                      vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>
                      ::emplace_back<unsigned_long_const&,slang::DiagnosticSeverity&>
                                ((vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>
                                  *)&ppVar20->second,local_d8,
                                 (DiagnosticSeverity *)(lVar27 + (ulong)uVar8 * 8 + 4));
                      goto LAB_0038fdc5;
                    }
                    uVar24 = uVar24 - 1 & uVar24;
                  } while (uVar24 != 0);
                }
                if (((&boost::unordered::detail::foa::
                       group15<boost::unordered::detail::foa::plain_integral>::
                       is_not_overflowed(unsigned_long)::shift)[(uint)uVar22 & 7] & bStack_59) == 0)
                break;
                uVar21 = *(ulong *)((long)local_f8 + local_e8 + -0x58);
                lVar27 = uVar25 + uVar14;
                uVar14 = uVar14 + 1;
                uVar25 = lVar27 + 1U & uVar21;
              } while (uVar14 <= uVar21);
              std::
              vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>
              ::emplace_back<unsigned_long_const&,std::nullopt_t_const&>
                        ((vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>
                          *)&ppVar20->second,local_d8,(nullopt_t *)&std::nullopt);
LAB_0038fdc5:
              puVar16 = iVar41.pc_ + 0x12;
              puVar18 = iVar41.pc_ + 2;
LAB_0038fdd0:
              puVar15 = puVar18;
              puVar18 = iVar41.pc_;
              ppVar28 = iVar41.p_ + 1;
              if (((uint)iVar41.pc_ & 0xf) != 0xe) goto code_r0x0038fdde;
              auVar31[0] = -(*puVar15 == '\0');
              auVar31[1] = -(puVar15[1] == '\0');
              auVar31[2] = -(puVar15[2] == '\0');
              auVar31[3] = -(puVar15[3] == '\0');
              auVar31[4] = -(puVar15[4] == '\0');
              auVar31[5] = -(puVar15[5] == '\0');
              auVar31[6] = -(puVar15[6] == '\0');
              auVar31[7] = -(puVar15[7] == '\0');
              auVar31[8] = -(puVar15[8] == '\0');
              auVar31[9] = -(puVar15[9] == '\0');
              auVar31[10] = -(puVar15[10] == '\0');
              auVar31[0xb] = -(puVar15[0xb] == '\0');
              auVar31[0xc] = -(puVar15[0xc] == '\0');
              auVar31[0xd] = -(puVar15[0xd] == '\0');
              auVar31[0xe] = -(puVar15[0xe] == '\0');
              auVar31[0xf] = -(puVar15[0xf] == '\0');
              uVar11 = (ushort)(SUB161(auVar31 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar31 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar31 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar31 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar31 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar31 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar31 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar31 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar31 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar31 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar31 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar31 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar31 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar31 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar31 >> 0x77,0) & 1) << 0xe;
              while (uVar11 == 0x7fff) {
                ppVar28 = ppVar28 + 0xf;
                auVar32[0] = -(*puVar16 == '\0');
                auVar32[1] = -(puVar16[1] == '\0');
                auVar32[2] = -(puVar16[2] == '\0');
                auVar32[3] = -(puVar16[3] == '\0');
                auVar32[4] = -(puVar16[4] == '\0');
                auVar32[5] = -(puVar16[5] == '\0');
                auVar32[6] = -(puVar16[6] == '\0');
                auVar32[7] = -(puVar16[7] == '\0');
                auVar32[8] = -(puVar16[8] == '\0');
                auVar32[9] = -(puVar16[9] == '\0');
                auVar32[10] = -(puVar16[10] == '\0');
                auVar32[0xb] = -(puVar16[0xb] == '\0');
                auVar32[0xc] = -(puVar16[0xc] == '\0');
                auVar32[0xd] = -(puVar16[0xd] == '\0');
                auVar32[0xe] = -(puVar16[0xe] == '\0');
                auVar32[0xf] = -(puVar16[0xf] == '\0');
                puVar15 = puVar16;
                puVar16 = puVar16 + 0x10;
                uVar11 = (ushort)(SUB161(auVar32 >> 7,0) & 1) |
                         (ushort)(SUB161(auVar32 >> 0xf,0) & 1) << 1 |
                         (ushort)(SUB161(auVar32 >> 0x17,0) & 1) << 2 |
                         (ushort)(SUB161(auVar32 >> 0x1f,0) & 1) << 3 |
                         (ushort)(SUB161(auVar32 >> 0x27,0) & 1) << 4 |
                         (ushort)(SUB161(auVar32 >> 0x2f,0) & 1) << 5 |
                         (ushort)(SUB161(auVar32 >> 0x37,0) & 1) << 6 |
                         (ushort)(SUB161(auVar32 >> 0x3f,0) & 1) << 7 |
                         (ushort)(SUB161(auVar32 >> 0x47,0) & 1) << 8 |
                         (ushort)(SUB161(auVar32 >> 0x4f,0) & 1) << 9 |
                         (ushort)(SUB161(auVar32 >> 0x57,0) & 1) << 10 |
                         (ushort)(SUB161(auVar32 >> 0x5f,0) & 1) << 0xb |
                         (ushort)(SUB161(auVar32 >> 0x67,0) & 1) << 0xc |
                         (ushort)(SUB161(auVar32 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar32 >> 0x77,0) & 1) << 0xe;
              }
              uVar24 = 0;
              if ((uVar11 ^ 0x7fff) != 0) {
                for (; ((uVar11 ^ 0x7fff) >> uVar24 & 1) == 0; uVar24 = uVar24 + 1) {
                }
              }
              if (puVar15[uVar24] == '\x01') break;
              iVar41.p_ = ppVar28 + uVar24;
              iVar41.pc_ = puVar15 + uVar24;
            } while( true );
          }
LAB_0038f94e:
          setMappingsFromPragmasImpl<slang::SourceManager::DiagnosticDirectiveInfo>
                    ((DiagnosticEngine *)&stack0xffffffffffffff40);
        }
      }
      else {
        if (uVar25 == 8) {
          if (*plVar26 == 0x5f5f687375705f5f) {
            std::
            vector<boost::unordered::unordered_flat_map<slang::DiagCode,slang::DiagnosticSeverity,slang::hash<slang::DiagCode,void>,std::equal_to<slang::DiagCode>,std::allocator<std::pair<slang::DiagCode_const,slang::DiagnosticSeverity>>>,std::allocator<boost::unordered::unordered_flat_map<slang::DiagCode,slang::DiagnosticSeverity,slang::hash<slang::DiagCode,void>,std::equal_to<slang::DiagCode>,std::allocator<std::pair<slang::DiagCode_const,slang::DiagnosticSeverity>>>>>
            ::
            emplace_back<boost::unordered::unordered_flat_map<slang::DiagCode,slang::DiagnosticSeverity,slang::hash<slang::DiagCode,void>,std::equal_to<slang::DiagCode>,std::allocator<std::pair<slang::DiagCode_const,slang::DiagnosticSeverity>>>&>
                      ((vector<boost::unordered::unordered_flat_map<slang::DiagCode,slang::DiagnosticSeverity,slang::hash<slang::DiagCode,void>,std::equal_to<slang::DiagCode>,std::allocator<std::pair<slang::DiagCode_const,slang::DiagnosticSeverity>>>,std::allocator<boost::unordered::unordered_flat_map<slang::DiagCode,slang::DiagnosticSeverity,slang::hash<slang::DiagCode,void>,std::equal_to<slang::DiagCode>,std::allocator<std::pair<slang::DiagCode_const,slang::DiagnosticSeverity>>>>>
                        *)&stack0xffffffffffffff38,
                       (unordered_flat_map<slang::DiagCode,_slang::DiagnosticSeverity,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>
                        *)&pSVar44[-1].diagDirectives.table_.
                           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo>_>,_slang::hash<slang::BufferID>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<const_slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo>_>_>_>
                           .arrays.groups_size_mask);
            goto LAB_0038fa1c;
          }
LAB_0038f96b:
          if ((short)*plVar26 == 0x572d) {
            uVar25 = uVar25 - 2;
            plVar26 = (long *)((long)plVar26 + 2);
          }
        }
        else if (1 < uVar25) goto LAB_0038f96b;
        pDVar13 = findDefaultDiagGroup(name);
        if (pDVar13 == (DiagGroup *)0x0) {
          sVar42 = findDiagsFromOptionName(name);
          if (sVar42._M_extent._M_extent_value._M_extent_value == 0) {
            this_00 = Diagnostics::add(local_90,(DiagCode)0x1000f,
                                       (SourceLocation)
                                       (directive->offset << 0x1c |
                                       (ulong)(local_10c.id & 0xfffffff)));
            arg._M_str = (char *)plVar26;
            arg._M_len = uVar25;
            Diagnostic::operator<<(this_00,arg);
          }
          else {
            lVar27 = 0;
            do {
              setMappingsFromPragmasImpl<slang::SourceManager::DiagnosticDirectiveInfo>(slang::BufferID,std::span<slang::SourceManager::DiagnosticDirectiveInfo_const,18446744073709551615ul>,slang::Diagnostics&)
              ::{lambda(slang::DiagCode,auto:1&)#1}::operator()
                        (&local_80,*(DiagCode *)((long)&(sVar42._M_ptr)->subsystem + lVar27),
                         directive);
              lVar27 = lVar27 + 4;
            } while (sVar42._M_extent._M_extent_value._M_extent_value << 2 != lVar27);
          }
        }
        else {
          pDVar6 = (pDVar13->diags).
                   super__Vector_base<slang::DiagCode,_std::allocator<slang::DiagCode>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          for (pDVar17 = (pDVar13->diags).
                         super__Vector_base<slang::DiagCode,_std::allocator<slang::DiagCode>_>.
                         _M_impl.super__Vector_impl_data._M_start; pDVar17 != pDVar6;
              pDVar17 = pDVar17 + 1) {
            setMappingsFromPragmasImpl<slang::SourceManager::DiagnosticDirectiveInfo>(slang::BufferID,std::span<slang::SourceManager::DiagnosticDirectiveInfo_const,18446744073709551615ul>,slang::Diagnostics&)
            ::{lambda(slang::DiagCode,auto:1&)#1}::operator()(&local_80,*pDVar17,directive);
          }
        }
      }
LAB_0038fa1c:
      directive = directive + 1;
    } while (directive != local_88);
  }
  std::
  vector<boost::unordered::unordered_flat_map<slang::DiagCode,_slang::DiagnosticSeverity,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>,_std::allocator<boost::unordered::unordered_flat_map<slang::DiagCode,_slang::DiagnosticSeverity,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>_>_>
  ::~vector((vector<boost::unordered::unordered_flat_map<slang::DiagCode,_slang::DiagnosticSeverity,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>,_std::allocator<boost::unordered::unordered_flat_map<slang::DiagCode,_slang::DiagnosticSeverity,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>_>_>
             *)&stack0xffffffffffffff38);
  return;
code_r0x0038fdde:
  iVar41.p_ = ppVar28;
  iVar41.pc_ = puVar18 + 1;
  puVar16 = puVar16 + 1;
  puVar18 = puVar15 + 1;
  if (puVar15[-1] != '\0') goto code_r0x0038fdef;
  goto LAB_0038fdd0;
code_r0x0038fdef:
  if (puVar15[-1] == '\x01') goto LAB_0038f94e;
  iVar41.pc_ = puVar15 + -1;
  goto LAB_0038fa4d;
}

Assistant:

void DiagnosticEngine::setMappingsFromPragmasImpl(BufferID buffer,
                                                  std::span<const TDirective> directives,
                                                  Diagnostics& diags) {

    // Store the state of diagnostics each time the user pushes,
    // and restore the state when they pop.
    std::vector<flat_hash_map<DiagCode, DiagnosticSeverity>> mappingStack;
    mappingStack.emplace_back();

    auto noteDiag = [&](DiagCode code, auto& directive) {
        diagMappings[code][buffer].emplace_back(directive.offset, directive.severity);
        mappingStack.back()[code] = directive.severity;
    };

    for (const SourceManager::DiagnosticDirectiveInfo& directive : directives) {
        auto name = directive.name;
        if (name == "__push__") {
            mappingStack.emplace_back(mappingStack.back());
        }
        else if (name == "__pop__") {
            // If the stack size is 1, push was never called, so just ignore.
            if (mappingStack.size() <= 1)
                continue;

            // Any directives that were set revert to their previous values.
            // If there is no previous value, they go back to the default (unset).
            auto& prev = mappingStack[mappingStack.size() - 2];
            for (auto [code, _] : mappingStack.back()) {
                auto& mappings = diagMappings[code][buffer];
                if (auto it = prev.find(code); it != prev.end())
                    mappings.emplace_back(directive.offset, it->second);
                else
                    mappings.emplace_back(directive.offset, std::nullopt);
            }
            mappingStack.pop_back();
        }
        else {
            if (name.starts_with("-W"sv))
                name = name.substr(2);

            if (auto group = findDiagGroup(name)) {
                for (auto code : group->getDiags())
                    noteDiag(code, directive);
            }
            else if (auto codes = findFromOptionName(name); !codes.empty()) {
                for (auto code : codes)
                    noteDiag(code, directive);
            }
            else {
                auto& diag = diags.add(diag::UnknownWarningOption,
                                       SourceLocation(buffer, directive.offset));
                diag << name;
            }
        }
    }
}